

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.c
# Opt level: O0

int us_socket_write(int ssl,us_socket_t *s,char *data,int length,int msg_more)

{
  int iVar1;
  int in_ECX;
  us_loop_t *in_RDX;
  us_socket_t *in_RSI;
  int in_EDI;
  int in_R8D;
  int written;
  char *unaff_retaddr;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  int in_stack_fffffffffffffffc;
  
  if (in_EDI == 0) {
    iVar1 = us_socket_is_closed(0,in_RSI);
    if ((iVar1 == 0) &&
       (iVar1 = us_socket_is_shut_down
                          (in_R8D,(us_socket_t *)
                                  CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8)),
       iVar1 == 0)) {
      us_poll_fd(&in_RSI->p);
      iVar1 = bsd_send(in_ECX,(char *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                       0,0x1067a0);
      if (iVar1 != in_ECX) {
        (in_RSI->context->loop->data).last_write_failed = 1;
        us_poll_change(&in_RSI->p,in_RDX,in_ECX);
      }
      if (iVar1 < 0) {
        iVar1 = 0;
      }
    }
    else {
      iVar1 = 0;
    }
  }
  else {
    iVar1 = us_internal_ssl_socket_write
                      ((us_internal_ssl_socket_t *)CONCAT44(length,msg_more),unaff_retaddr,
                       in_stack_fffffffffffffffc,in_EDI);
  }
  return iVar1;
}

Assistant:

int us_socket_write(int ssl, struct us_socket_t *s, const char *data, int length, int msg_more) {
#ifndef LIBUS_NO_SSL
    if (ssl) {
        return us_internal_ssl_socket_write((struct us_internal_ssl_socket_t *) s, data, length, msg_more);
    }
#endif

    if (us_socket_is_closed(ssl, s) || us_socket_is_shut_down(ssl, s)) {
        return 0;
    }

    int written = bsd_send(us_poll_fd(&s->p), data, length, msg_more);
    if (written != length) {
        s->context->loop->data.last_write_failed = 1;
        us_poll_change(&s->p, s->context->loop, LIBUS_SOCKET_READABLE | LIBUS_SOCKET_WRITABLE);
    }

    return written < 0 ? 0 : written;
}